

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O2

void __thiscall
slang::ast::CaseStatement::serializeTo(CaseStatement *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  ItemGroup *item;
  pointer pIVar4;
  pointer pIVar5;
  string_view sVar6;
  string_view name;
  
  sVar6 = ast::toString(this->condition);
  ASTSerializer::write(serializer,9,"condition",sVar6._M_len);
  sVar6 = ast::toString(this->check);
  ASTSerializer::write(serializer,5,"check",sVar6._M_len);
  ASTSerializer::write(serializer,4,"expr",(size_t)this->expr);
  sVar6._M_str = "items";
  sVar6._M_len = 5;
  ASTSerializer::startArray(serializer,sVar6);
  pIVar4 = (this->items)._M_ptr;
  pIVar5 = pIVar4 + (this->items)._M_extent._M_extent_value;
  for (; pIVar4 != pIVar5; pIVar4 = pIVar4 + 1) {
    ASTSerializer::startObject(serializer);
    name._M_str = "expressions";
    name._M_len = 0xb;
    ASTSerializer::startArray(serializer,name);
    ppEVar1 = (pIVar4->expressions)._M_ptr;
    sVar2 = (pIVar4->expressions)._M_extent._M_extent_value;
    for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
    }
    ASTSerializer::endArray(serializer);
    ASTSerializer::write(serializer,4,"stmt",(size_t)(pIVar4->stmt).ptr);
    ASTSerializer::endObject(serializer);
  }
  ASTSerializer::endArray(serializer);
  if (this->defaultCase != (Statement *)0x0) {
    ASTSerializer::write(serializer,0xb,"defaultCase",(size_t)this->defaultCase);
    return;
  }
  return;
}

Assistant:

void CaseStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("condition", toString(condition));
    serializer.write("check", toString(check));
    serializer.write("expr", expr);
    serializer.startArray("items");
    for (auto const& item : items) {
        serializer.startObject();

        serializer.startArray("expressions");
        for (auto ex : item.expressions) {
            serializer.serialize(*ex);
        }
        serializer.endArray();

        serializer.write("stmt", *item.stmt);

        serializer.endObject();
    }
    serializer.endArray();

    if (defaultCase) {
        serializer.write("defaultCase", *defaultCase);
    }
}